

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void outputUnitToLaTeX(LaTeX *latex,ofstream *latexOut,Unit *u,uint index)

{
  _Alloc_hider _Var1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  string stringform;
  char local_49;
  string local_48;
  
  Shell::LaTeX::toString_abi_cxx11_(&local_48,latex,u);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)latexOut);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," & ",3);
  cVar2 = *local_48._M_dataplus._M_p;
  if (cVar2 != '\0') {
    uVar4 = 0;
    _Var1._M_p = local_48._M_dataplus._M_p;
    do {
      local_49 = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)latexOut,&local_49,1);
      uVar4 = uVar4 + 1;
      if ((0x50 < uVar4) && (*_Var1._M_p == ' ')) {
        uVar4 = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)latexOut,"\\\\ \n & ~~~~~",0xc);
      }
      cVar2 = _Var1._M_p[1];
      _Var1._M_p = _Var1._M_p + 1;
    } while (cVar2 != '\0');
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)latexOut,"\\\\",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)latexOut + -0x18) + (char)latexOut);
  std::ostream::put((char)latexOut);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void outputUnitToLaTeX(LaTeX& latex, ofstream& latexOut, Unit* u,unsigned index)
{
    std::string stringform = latex.toString(u);
    latexOut << index++ << " & ";
    unsigned count = 0;
    for(const char* p = stringform.c_str();*p;p++){
      latexOut << *p;
      count++;
      if(count>80 && *p==' '){
        latexOut << "\\\\ \n & ~~~~~";
        count=0;
      }
    }
    latexOut << "\\\\" << endl;
}